

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O0

void __thiscall PRED<RemSP>::PerformLabeling(PRED<RemSP> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  uint *puVar6;
  uint *puVar7;
  uchar *puVar8;
  uint *e;
  uint *b;
  int r_i;
  int c_1;
  uint *img_labels_row_prev;
  uint *img_labels_row_1;
  uchar *img_row_prev;
  uchar *img_row_1;
  int r;
  int c;
  uint *img_labels_row;
  uchar *img_row;
  int h;
  int w;
  int local_7c;
  Size local_78;
  Mat_<int> local_70;
  PRED<RemSP> *local_10;
  PRED<RemSP> *this_local;
  
  local_10 = this;
  cv::MatSize::operator()((MatSize *)&local_78);
  local_7c = 0;
  cv::Mat_<int>::Mat_(&local_70,&local_78,&local_7c);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_70)
  ;
  cv::Mat_<int>::~Mat_(&local_70);
  RemSP::Alloc(((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1)
               / 2) * ((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                 field_0xc + 1) / 2) + 1);
  RemSP::Setup();
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  puVar5 = cv::Mat::ptr<unsigned_char>
                     (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
  puVar6 = cv::Mat::ptr<unsigned_int>
                     (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,0
                     );
  img_row_1._4_4_ = -1;
  iVar3 = img_row_1._4_4_;
  while (img_row_1._4_4_ = iVar3, iVar3 = img_row_1._4_4_ + 1, iVar3 < iVar1) {
    if (puVar5[iVar3] != '\0') {
      uVar4 = RemSP::NewLabel();
      puVar6[iVar3] = uVar4;
      img_row_1._4_4_ = iVar3;
      while( true ) {
        iVar3 = img_row_1._4_4_ + 1;
        if (iVar1 <= iVar3) goto LAB_001fcc59;
        if (puVar5[iVar3] == '\0') break;
        puVar6[iVar3] = puVar6[img_row_1._4_4_];
        img_row_1._4_4_ = iVar3;
      }
    }
  }
LAB_001fcc59:
  img_row_1._0_4_ = 1;
  do {
    if (iVar2 <= (int)img_row_1) {
      uVar4 = RemSP::Flatten();
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar4;
      for (b._0_4_ = 0;
          (int)b < *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                            field_0x8; b._0_4_ = (int)b + 1) {
        e = cv::Mat::ptr<unsigned_int>
                      (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                       (int)b);
        puVar6 = e + *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                              field_0xc;
        for (; e != puVar6; e = e + 1) {
          uVar4 = RemSP::GetLabel(*e);
          *e = uVar4;
        }
      }
      RemSP::Dealloc();
      return;
    }
    puVar5 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row_1);
    puVar8 = puVar5 + -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                   field_0x48;
    puVar6 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,(int)img_row_1);
    puVar7 = (uint *)((long)puVar6 -
                     **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                                 field_0x48);
    b._4_4_ = 0;
    if (iVar1 == 1) {
      if (*puVar5 != '\0') {
        if (*puVar8 == '\0') {
          uVar4 = RemSP::NewLabel();
          *puVar6 = uVar4;
        }
        else {
          *puVar6 = *puVar7;
        }
      }
    }
    else {
      iVar3 = b._4_4_;
      if (*puVar5 == '\0') goto LAB_001fd011;
      if (*puVar8 == '\0') {
        if (puVar8[1] == '\0') {
          uVar4 = RemSP::NewLabel();
          *puVar6 = uVar4;
          goto LAB_001fcf42;
        }
        *puVar6 = puVar7[1];
        goto LAB_001fcede;
      }
      *puVar6 = *puVar7;
LAB_001fcdd7:
      iVar3 = b._4_4_ + 1;
      if (iVar3 < iVar1 + -1) {
        if (puVar5[iVar3] == '\0') goto LAB_001fd011;
        if (puVar8[iVar3] == '\0') {
          if (puVar8[b._4_4_ + 2] == '\0') {
            puVar6[iVar3] = puVar6[b._4_4_];
            b._4_4_ = iVar3;
            goto LAB_001fcf42;
          }
          uVar4 = RemSP::Merge(puVar6[b._4_4_],puVar7[b._4_4_ + 2]);
          puVar6[iVar3] = uVar4;
          b._4_4_ = iVar3;
LAB_001fcede:
          do {
            iVar3 = b._4_4_ + 1;
            if (iVar1 + -1 <= iVar3) {
              if (puVar5[iVar3] != '\0') {
                puVar6[iVar3] = puVar7[iVar3];
              }
              goto LAB_001fd3ce;
            }
            if (puVar5[iVar3] != '\0') {
              puVar6[iVar3] = puVar7[iVar3];
              b._4_4_ = iVar3;
              goto LAB_001fcdd7;
            }
LAB_001fd011:
            while( true ) {
              do {
                b._4_4_ = iVar3;
                iVar3 = b._4_4_ + 1;
                if (iVar1 + -1 <= iVar3) {
                  if (puVar5[iVar3] != '\0') {
                    if (puVar8[iVar3] == '\0') {
                      if (puVar8[b._4_4_] == '\0') {
                        uVar4 = RemSP::NewLabel();
                        puVar6[iVar3] = uVar4;
                      }
                      else {
                        puVar6[iVar3] = puVar7[b._4_4_];
                      }
                    }
                    else {
                      puVar6[iVar3] = puVar7[iVar3];
                    }
                  }
                  goto LAB_001fd3ce;
                }
              } while (puVar5[iVar3] == '\0');
              if (puVar8[iVar3] != '\0') {
                puVar6[iVar3] = puVar7[iVar3];
                b._4_4_ = iVar3;
                goto LAB_001fcdd7;
              }
              if (puVar8[b._4_4_ + 2] != '\0') break;
              if (puVar8[b._4_4_] == '\0') {
                uVar4 = RemSP::NewLabel();
                puVar6[iVar3] = uVar4;
                b._4_4_ = iVar3;
              }
              else {
                puVar6[iVar3] = puVar7[b._4_4_];
                b._4_4_ = iVar3;
              }
LAB_001fcf42:
              while( true ) {
                iVar3 = b._4_4_ + 1;
                if (iVar1 + -1 <= iVar3) {
                  if (puVar5[iVar3] != '\0') {
                    puVar6[iVar3] = puVar6[b._4_4_];
                  }
                  goto LAB_001fd3ce;
                }
                if (puVar5[iVar3] == '\0') break;
                if (puVar8[b._4_4_ + 2] != '\0') {
                  uVar4 = RemSP::Merge(puVar6[b._4_4_],puVar7[b._4_4_ + 2]);
                  puVar6[iVar3] = uVar4;
                  b._4_4_ = iVar3;
                  goto LAB_001fcede;
                }
                puVar6[iVar3] = puVar6[b._4_4_];
                b._4_4_ = iVar3;
              }
            }
            if (puVar8[b._4_4_] == '\0') {
              puVar6[iVar3] = puVar7[b._4_4_ + 2];
              b._4_4_ = iVar3;
            }
            else {
              uVar4 = RemSP::Merge(puVar7[b._4_4_],puVar7[b._4_4_ + 2]);
              puVar6[iVar3] = uVar4;
              b._4_4_ = iVar3;
            }
          } while( true );
        }
        puVar6[iVar3] = puVar7[iVar3];
        b._4_4_ = iVar3;
        goto LAB_001fcdd7;
      }
      if (puVar5[iVar3] != '\0') {
        if (puVar8[iVar3] == '\0') {
          puVar6[iVar3] = puVar6[b._4_4_];
        }
        else {
          puVar6[iVar3] = puVar7[iVar3];
        }
      }
    }
LAB_001fd3ce:
    img_row_1._0_4_ = (int)img_row_1 + 1;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

    // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }

        LabelsSolver::Dealloc();
    }